

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.c
# Opt level: O3

int formt_(integer *m,doublereal *wt,doublereal *sy,doublereal *ss,integer *col,doublereal *theta,
          integer *info)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  doublereal *pdVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  
  uVar1 = *col;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)*m;
    uVar10 = ~uVar3;
    lVar4 = uVar10 * 8 + uVar3 * 8 + 8;
    uVar11 = (ulong)uVar1;
    do {
      *(double *)((long)wt + lVar4) = *theta * *(double *)((long)ss + lVar4);
      lVar4 = lVar4 + uVar3 * 8;
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    if (uVar1 != 1) {
      uVar11 = (ulong)uVar1 + 1;
      uVar12 = 2;
      lVar9 = 0x10;
      uVar13 = uVar12;
      lVar4 = lVar9;
      do {
        do {
          uVar2 = uVar12;
          if ((int)uVar13 < (int)uVar12) {
            uVar2 = uVar13;
          }
          dVar14 = 0.0;
          uVar5 = 1;
          pdVar7 = sy + uVar3 + uVar10 + 1;
          pdVar8 = sy + uVar3 + uVar10;
          do {
            dVar14 = dVar14 + (*(double *)((long)pdVar8 + lVar4) * *(double *)((long)pdVar8 + lVar9)
                              ) / *pdVar7;
            uVar5 = uVar5 + 1;
            pdVar7 = pdVar7 + uVar3 + 1;
            pdVar8 = pdVar8 + uVar3;
          } while (uVar5 < (uVar2 & 0xffffffff));
          lVar6 = uVar12 * uVar3 + uVar13;
          wt[uVar10 + lVar6] = *theta * ss[uVar10 + lVar6] + dVar14;
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 8;
        } while (uVar12 != uVar11);
        uVar12 = uVar13 + 1;
        lVar9 = lVar4 + 8;
        uVar13 = uVar12;
        lVar4 = lVar9;
      } while (uVar12 != uVar11);
    }
  }
  dpofa_(wt,m,col,info);
  if (*info != 0) {
    *info = -3;
  }
  return 0;
}

Assistant:

int formt_(integer *m, doublereal *wt, doublereal *sy, 
	doublereal *ss, integer *col, doublereal *theta, integer *info)
{
    /* System generated locals */
    integer wt_dim1, wt_offset, sy_dim1, sy_offset, ss_dim1, ss_offset, i__1, 
	    i__2, i__3;

    /* Local variables */
    static integer i__, j, k, k1;
    static doublereal ddum;
    extern /* Subroutine */ int dpofa_(doublereal *, integer *, integer *, 
	    integer *);

/*     ************ */

/*     Subroutine formt */

/*       This subroutine forms the upper half of the pos. def. and symm. */
/*         T = theta*SS + L*D^(-1)*L', stores T in the upper triangle */
/*         of the array wt, and performs the Cholesky factorization of T */
/*         to produce J*J', with J' stored in the upper triangle of wt. */

/*     Subprograms called: */

/*       Linpack ... dpofa. */


/*                           *  *  * */

/*     NEOS, November 1994. (Latest revision June 1996.) */
/*     Optimization Technology Center. */
/*     Argonne National Laboratory and Northwestern University. */
/*     Written by */
/*                        Ciyou Zhu */
/*     in collaboration with R.H. Byrd, P. Lu-Chen and J. Nocedal. */


/*     ************ */
/*     Form the upper half of  T = theta*SS + L*D^(-1)*L', */
/*        store T in the upper triangle of the array wt. */
    /* Parameter adjustments */
    ss_dim1 = *m;
    ss_offset = 1 + ss_dim1;
    ss -= ss_offset;
    sy_dim1 = *m;
    sy_offset = 1 + sy_dim1;
    sy -= sy_offset;
    wt_dim1 = *m;
    wt_offset = 1 + wt_dim1;
    wt -= wt_offset;

    /* Function Body */
    i__1 = *col;
    for (j = 1; j <= i__1; ++j) {
	wt[j * wt_dim1 + 1] = *theta * ss[j * ss_dim1 + 1];
/* L52: */
    }
    i__1 = *col;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *col;
	for (j = i__; j <= i__2; ++j) {
	    k1 = min(i__,j) - 1;
	    ddum = 0.;
	    i__3 = k1;
	    for (k = 1; k <= i__3; ++k) {
		ddum += sy[i__ + k * sy_dim1] * sy[j + k * sy_dim1] / sy[k + 
			k * sy_dim1];
/* L53: */
	    }
	    wt[i__ + j * wt_dim1] = ddum + *theta * ss[i__ + j * ss_dim1];
/* L54: */
	}
/* L55: */
    }
/*     Cholesky factorize T to J*J' with */
/*        J' stored in the upper triangle of wt. */
    dpofa_(&wt[wt_offset], m, col, info);
    if (*info != 0) {
	*info = -3;
    }
    return 0;
}